

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_debugInfo_attribute_ref1
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t attribute,uint8_t value)

{
  uint8_t value_local;
  uintptr_t attribute_local;
  sysbvm_dwarf_debugInfo_builder_t *builder_local;
  
  sysbvm_dwarf_encodeULEB128(&builder->abbrev,attribute);
  sysbvm_dwarf_encodeULEB128(&builder->abbrev,0x11);
  sysbvm_dwarf_encodeByte(&builder->info,value);
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_ref1(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t attribute, uint8_t value)
{
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, attribute);
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, DW_FORM_ref1);
    sysbvm_dwarf_encodeByte(&builder->info, value);
}